

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::detail::ElementsAreMatcherBase::
Check<0,3,int_const*,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>>
          (AssertionResult *__return_storage_ptr__,ElementsAreMatcherBase *this,int *it,int *end,
          tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
          *matchers)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  type **in_R9;
  size_t cnt;
  ulong local_50;
  int local_44;
  AssertionResult local_40;
  
  local_50 = (long)it - (long)this >> 2;
  if (local_50 < 4) {
    paVar1 = &local_40.m_message.field_2;
    local_40.m_message._M_string_length = 0;
    local_40.m_message.field_2._M_local_buf[0] = '\0';
    local_40.m_result = false;
    local_40.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar3 = AssertionResult::operator<<(&local_40,(char (*) [23])"ElementsAre: argument[");
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_50);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [16])"] is less than ");
    local_44 = 4;
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_44);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar3->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.m_message._M_dataplus._M_p,
                      CONCAT71(local_40.m_message.field_2._M_allocated_capacity._1_7_,
                               local_40.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    CheckElem<0,3,int_const*,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>>
              (__return_storage_ptr__,this,it,end,
               (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
                *)&iutest_type_traits::enabler_t<void>::value,in_R9);
  }
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Check(Ite it, Ite end, M& matchers)
    {
        const size_t cnt = ::std::distance(it, end);
        if IUTEST_COND_UNLIKELY( cnt < LAST+1 )
        {
            return AssertionFailure() << "ElementsAre: argument[" << cnt << "] is less than " << LAST+1;
        }